

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::grow_and_add
          (FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false> *this,uint newSize,
          ExpiredCodeBlock *val)

{
  uint uVar1;
  ExpiredCodeBlock *pEVar2;
  ExpiredCodeBlock *pEVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined4 uVar6;
  
  pEVar2 = this->data;
  grow_no_destroy(this,newSize);
  pEVar3 = this->data;
  uVar1 = this->count;
  this->count = uVar1 + 1;
  pEVar3[uVar1].unwindTable = val->unwindTable;
  uVar4 = *(undefined4 *)((long)&val->code + 4);
  uVar5 = val->codeSize;
  uVar6 = *(undefined4 *)&val->field_0xc;
  pEVar3 = pEVar3 + uVar1;
  *(undefined4 *)&pEVar3->code = *(undefined4 *)&val->code;
  *(undefined4 *)((long)&pEVar3->code + 4) = uVar4;
  pEVar3->codeSize = uVar5;
  *(undefined4 *)&pEVar3->field_0xc = uVar6;
  if (pEVar2 != (ExpiredCodeBlock *)0x0) {
    (*(code *)NULLC::dealloc)(pEVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}